

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.cc
# Opt level: O0

size_t __thiscall MutableS2ShapeIndex::SpaceUsed(MutableS2ShapeIndex *this)

{
  undefined8 uVar1;
  bool bVar2;
  size_type_conflict sVar3;
  int iVar4;
  size_type sVar5;
  size_type sVar6;
  compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *this_00;
  S2ClippedShape *this_01;
  pointer this_02;
  S2ClippedShape *clipped;
  int s;
  S2ShapeIndexCell *cell;
  undefined1 local_58 [8];
  Iterator it;
  size_t size;
  MutableS2ShapeIndex *this_local;
  
  it.end_.position = 0x58;
  it.end_._12_4_ = 0;
  sVar5 = std::
          vector<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>,_std::allocator<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_>_>
          ::capacity(&this->shapes_);
  it.end_._8_8_ = it.end_._8_8_ + sVar5 * 8;
  sVar6 = gtl::internal_btree::
          btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
          ::bytes_used((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                        *)&this->cell_map_);
  it.end_._8_8_ = sVar6 + -0x18 + it.end_._8_8_;
  sVar6 = gtl::internal_btree::
          btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
          ::size((btree_container<gtl::internal_btree::btree<gtl::internal_btree::map_params<S2CellId,_S2ShapeIndexCell_*,_std::less<S2CellId>,_std::allocator<std::pair<const_S2CellId,_S2ShapeIndexCell_*>_>,_256,_false>_>_>
                  *)&this->cell_map_);
  it.end_._8_8_ = it.end_._8_8_ + sVar6 * 0x10;
  Iterator::Iterator((Iterator *)local_58);
  Iterator::InitStale((Iterator *)local_58,this,BEGIN);
  while (bVar2 = S2ShapeIndex::IteratorBase::done((IteratorBase *)local_58),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    this_00 = (compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)
              Iterator::cell((Iterator *)local_58);
    sVar3 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::capacity
                      (this_00);
    it.end_._8_8_ = (ulong)sVar3 * 0x10 + it.end_._8_8_;
    for (clipped._4_4_ = 0; iVar4 = S2ShapeIndexCell::num_clipped((S2ShapeIndexCell *)this_00),
        clipped._4_4_ < iVar4; clipped._4_4_ = clipped._4_4_ + 1) {
      this_01 = S2ShapeIndexCell::clipped((S2ShapeIndexCell *)this_00,clipped._4_4_);
      bVar2 = S2ClippedShape::is_inline(this_01);
      if (!bVar2) {
        iVar4 = S2ClippedShape::num_edges(this_01);
        it.end_._8_8_ = (long)iVar4 * 4 + it.end_._8_8_;
      }
    }
    Iterator::Next((Iterator *)local_58);
  }
  bVar2 = std::operator!=(&this->pending_removals_,(nullptr_t)0x0);
  if (bVar2) {
    this_02 = std::
              unique_ptr<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>,_std::default_delete<std::vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>_>_>
              ::operator->(&this->pending_removals_);
    sVar5 = std::
            vector<MutableS2ShapeIndex::RemovedShape,_std::allocator<MutableS2ShapeIndex::RemovedShape>_>
            ::capacity(this_02);
    it.end_._8_8_ = sVar5 * 0x20 + it.end_._8_8_;
  }
  uVar1 = it.end_._8_8_;
  Iterator::~Iterator((Iterator *)local_58);
  return uVar1;
}

Assistant:

size_t MutableS2ShapeIndex::SpaceUsed() const {
  size_t size = sizeof(*this);
  size += shapes_.capacity() * sizeof(std::unique_ptr<S2Shape>);
  // cell_map_ itself is already included in sizeof(*this).
  size += cell_map_.bytes_used() - sizeof(cell_map_);
  size += cell_map_.size() * sizeof(S2ShapeIndexCell);
  Iterator it;
  for (it.InitStale(this, S2ShapeIndex::BEGIN); !it.done(); it.Next()) {
    const S2ShapeIndexCell& cell = it.cell();
    size += cell.shapes_.capacity() * sizeof(S2ClippedShape);
    for (int s = 0; s < cell.num_clipped(); ++s) {
      const S2ClippedShape& clipped = cell.clipped(s);
      if (!clipped.is_inline()) {
        size += clipped.num_edges() * sizeof(int32);
      }
    }
  }
  if (pending_removals_ != nullptr) {
    size += pending_removals_->capacity() * sizeof(RemovedShape);
  }

  return size;
}